

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void __thiscall QLibrary::setLoadHints(QLibrary *this,LoadHints hints)

{
  bool bVar1;
  QLibraryPrivate *other;
  QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *in_RDI;
  long in_FS_OFFSET;
  QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> in_stack_ffffffffffffff68;
  QLibraryPrivate *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  QFlagsStorage<QLibrary::LoadHint> loadHints;
  undefined1 local_30 [24];
  quintptr local_18;
  long local_8;
  
  loadHints.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RDI[2].d;
  bVar1 = operator!(in_stack_ffffffffffffff68);
  if (bVar1) {
    loadHints.i = (Int)((ulong)local_30 >> 0x20);
    QString::QString((QString *)0x8c5ba3);
    QString::QString((QString *)0x8c5bb2);
    QFlags<QLibrary::LoadHint>::QFlags((QFlags<QLibrary::LoadHint> *)0x8c5bc4);
    other = QLibraryPrivate::findOrCreate
                      (&in_stack_ffffffffffffff70->fileName,(QString *)in_stack_ffffffffffffff68.d,
                       (LoadHints)loadHints.i);
    QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator=<QLibraryPrivate,_false>
              (in_RDI,other);
    QString::~QString((QString *)0x8c5bfb);
    QString::~QString((QString *)0x8c5c05);
    QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
              ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c5c13);
    QString::clear(&in_stack_ffffffffffffff70->fileName);
  }
  QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
            ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c5c57);
  QLibraryPrivate::setLoadHints(in_stack_ffffffffffffff70,(LoadHints)loadHints.i);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLibrary::setLoadHints(LoadHints hints)
{
    if (!d) {
        d = QLibraryPrivate::findOrCreate(QString());   // ugly, but we need a d-ptr
        d->errorString.clear();
    }
    d->setLoadHints(hints);
}